

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  byte *pbVar2;
  byte *pInLimit;
  U32 *pUVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  U32 UVar6;
  U32 UVar7;
  ulong uVar8;
  ldmEntry_t *plVar9;
  U64 UVar10;
  rawSeq *prVar11;
  undefined4 uVar12;
  ldmParams_t ldmParams;
  U32 UVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  U32 UVar18;
  size_t pos;
  BYTE *pBase;
  ulong uVar19;
  byte *pbVar20;
  size_t sVar21;
  size_t sVar22;
  byte *pIn;
  BYTE *pBase_00;
  byte *pbVar23;
  byte *pbVar24;
  byte *pInLimit_00;
  ulong uVar25;
  ldmEntry_t *plVar26;
  uint uVar27;
  long lVar28;
  U32 UVar29;
  U32 offset;
  BYTE *pBVar30;
  U32 hbits;
  void *pvVar31;
  byte *pAnchor;
  BYTE *pBVar32;
  BYTE *pBVar33;
  long lVar34;
  ulong uVar35;
  U64 hash;
  ulong uVar36;
  size_t local_180;
  int iStack_12c;
  size_t local_b0;
  ldmEntry_t *local_a8;
  ulong local_98;
  
  uVar14 = 1 << ((byte)params->windowLog & 0x1f);
  lVar34 = 0;
  pvVar31 = src;
  uVar35 = 0;
LAB_0037bbce:
  if ((lVar34 == ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0)) ||
     (uVar8 = sequences->size, sequences->capacity <= uVar8)) {
    return 0;
  }
  pbVar2 = (byte *)((long)src + lVar34 * 0x100000);
  pbVar23 = pbVar2 + 0x100000;
  if (srcSize + lVar34 * -0x100000 < 0x100000) {
    pbVar23 = (byte *)((long)src + srcSize);
  }
  pBVar32 = (ldmState->window).base;
  uVar15 = (int)pbVar23 - (int)pBVar32;
  if (0xe0000000 < uVar15) {
    UVar13 = params->hashLog;
    uVar15 = ((int)src - (int)pBVar32) - uVar14;
    (ldmState->window).base = pBVar32 + uVar15;
    ppBVar1 = &(ldmState->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar15;
    uVar4 = (ldmState->window).dictLimit;
    uVar5 = (ldmState->window).lowLimit;
    (ldmState->window).dictLimit = uVar4 - uVar15;
    (ldmState->window).lowLimit = uVar5 - uVar15;
    plVar9 = ldmState->hashTable;
    for (lVar28 = 0; 1L << ((byte)UVar13 & 0x3f) != lVar28; lVar28 = lVar28 + 1) {
      uVar16 = plVar9[lVar28].offset;
      UVar29 = uVar16 - uVar15;
      if (uVar16 < uVar15) {
        UVar29 = 0;
      }
      plVar9[lVar28].offset = UVar29;
    }
    pBVar32 = (ldmState->window).base;
    uVar15 = (int)pbVar23 - (int)pBVar32;
  }
  uVar16 = uVar15 - uVar14;
  if (uVar15 < uVar14 || uVar16 == 0) {
    uVar15 = (ldmState->window).dictLimit;
    uVar27 = (ldmState->window).lowLimit;
  }
  else {
    uVar27 = (ldmState->window).lowLimit;
    if (uVar27 < uVar16) {
      (ldmState->window).lowLimit = uVar16;
      uVar27 = uVar16;
    }
    uVar15 = (ldmState->window).dictLimit;
    if (uVar15 < uVar27) {
      (ldmState->window).dictLimit = uVar27;
      uVar15 = uVar27;
    }
  }
  UVar13 = params->bucketSizeLog;
  UVar29 = params->hashRateLog;
  UVar6 = params->hashLog;
  uVar16 = params->minMatchLength;
  uVar36 = (ulong)uVar16;
  UVar10 = ldmState->hashPower;
  if (uVar27 < uVar15) {
    pBVar30 = (ldmState->window).dictBase;
    uVar17 = uVar27;
  }
  else {
    pBVar30 = (BYTE *)0x0;
    uVar17 = uVar15;
  }
  hbits = UVar6 - UVar13;
  pBase = pBVar32 + uVar15;
  uVar19 = 8;
  if (8 < uVar16) {
    uVar19 = (ulong)uVar16;
  }
  pInLimit = pbVar2 + ((long)pbVar23 - (long)pbVar2);
  hash = 0;
  pIn = (byte *)0x0;
  pAnchor = pbVar2;
LAB_0037bdef:
  offset = (1 - (int)pBVar32) + (int)pAnchor;
  pbVar20 = pIn;
  pIn = pAnchor;
  pbVar24 = pAnchor;
  do {
    pbVar24 = pbVar24 + 1;
    if (pInLimit + -uVar19 < pIn) {
      uVar36 = (long)pbVar23 - (long)pAnchor;
      if (0xffffffffffffff88 < uVar36) {
        return uVar36;
      }
      if (uVar8 < sequences->size) {
        pUVar3 = &sequences->seq[uVar8].litLength;
        *pUVar3 = *pUVar3 + (int)uVar35;
      }
      else {
        uVar36 = ((long)pbVar23 - (long)pbVar2) + uVar35;
      }
      lVar34 = lVar34 + 1;
      pvVar31 = (void *)((long)pvVar31 + 0x100000);
      uVar35 = uVar36;
      goto LAB_0037bbce;
    }
    if (pIn == pbVar2) {
      hash = 0;
      for (uVar25 = 0; uVar36 != uVar25; uVar25 = uVar25 + 1) {
        hash = hash * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar31 + uVar25) + 10;
      }
    }
    else {
      hash = (hash - ((ulong)*pbVar20 + 10) * UVar10) * -0x30e44323485a9b9d + (ulong)pbVar20[uVar36]
             + 10;
    }
    UVar18 = ZSTD_ldm_getTag(hash,hbits,UVar29);
    if ((UVar18 ^ -1 << ((byte)UVar29 & 0x1f)) == 0xffffffff) {
      UVar18 = (int)pIn - (int)pBVar32;
      uVar25 = hash >> (0x40U - (char)hbits & 0x3f) & 0xffffffff;
      if (UVar6 == UVar13) {
        uVar25 = 0;
      }
      plVar26 = ldmState->hashTable + (uVar25 << ((byte)params->bucketSizeLog & 0x3f));
      plVar9 = plVar26 + (1L << ((byte)UVar13 & 0x3f));
      local_98 = 0;
      local_a8 = (ldmEntry_t *)0x0;
      local_b0 = 0;
      local_180 = 0;
      for (; plVar26 < plVar9; plVar26 = plVar26 + 1) {
        if (plVar26->checksum == (U32)(hash >> (0x20U - (char)hbits & 0x3f))) {
          uVar16 = plVar26->offset;
          if (uVar17 < uVar16) {
            if (uVar27 < uVar15) {
              pbVar20 = pBVar30 + uVar15;
              pBVar33 = pBVar30;
              if (uVar15 <= uVar16) {
                pbVar20 = pInLimit;
                pBVar33 = pBVar32;
              }
              pBVar33 = pBVar33 + uVar16;
              pInLimit_00 = pIn + ((long)pbVar20 - (long)pBVar33);
              if (pbVar23 <= pIn + ((long)pbVar20 - (long)pBVar33)) {
                pInLimit_00 = pInLimit;
              }
              sVar21 = ZSTD_count(pIn,pBVar33,pInLimit_00);
              if (pBVar33 + sVar21 == pbVar20) {
                sVar22 = ZSTD_count(pIn + sVar21,pBase,pInLimit);
                sVar21 = sVar21 + sVar22;
              }
              if (uVar36 <= sVar21) {
                pBase_00 = pBVar30 + uVar17;
                if (uVar15 <= uVar16) {
                  pBase_00 = pBase;
                }
                sVar22 = ZSTD_ldm_countBackwardsMatch(pIn,pAnchor,pBVar33,pBase_00);
                uVar25 = sVar22 + sVar21;
LAB_0037c064:
                if (local_98 < uVar25) {
                  local_180 = sVar21;
                  local_b0 = sVar22;
                  local_a8 = plVar26;
                  local_98 = uVar25;
                }
              }
            }
            else {
              sVar21 = ZSTD_count(pIn,pBVar32 + uVar16,pInLimit);
              if (uVar36 <= sVar21) {
                sVar22 = ZSTD_ldm_countBackwardsMatch(pIn,pAnchor,pBVar32 + uVar16,pBase);
                uVar25 = sVar22 + sVar21;
                goto LAB_0037c064;
              }
            }
          }
        }
      }
      if (local_a8 != (ldmEntry_t *)0x0) break;
      ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar18,*params);
    }
    offset = offset + 1;
    pbVar20 = pIn;
    pIn = pIn + 1;
  } while( true );
  sVar21 = sequences->size;
  if (sVar21 == sequences->capacity) {
    return 0xffffffffffffffba;
  }
  prVar11 = sequences->seq;
  UVar7 = local_a8->offset;
  prVar11[sVar21].litLength = ((int)pIn - (int)local_b0) - (int)pAnchor;
  prVar11[sVar21].matchLength = (int)local_b0 + (int)local_180;
  prVar11[sVar21].offset = UVar18 - UVar7;
  sequences->size = sVar21 + 1;
  ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar18,*params);
  pAnchor = pIn + local_180;
  if (pAnchor <= pInLimit + -uVar19) {
    uVar12 = params->minMatchLength;
    ldmParams = *params;
    for (; pbVar24 < pAnchor; pbVar24 = pbVar24 + 1) {
      hash = (hash - ((ulong)pbVar24[-1] + 10) * ldmState->hashPower) * -0x30e44323485a9b9d +
             (ulong)pbVar24[uVar12 - 1] + 10;
      ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,offset,ldmParams);
      offset = offset + 1;
    }
    pIn = pAnchor + -1;
  }
  goto LAB_0037bdef;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}